

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::anon_unknown_123::AsyncPipe::~AsyncPipe(AsyncPipe *this)

{
  ForkHub<kj::_::Void> *pFVar1;
  Disposer *pDVar2;
  PromiseFulfiller<void> *pPVar3;
  AsyncCapabilityStream *pAVar4;
  bool _kjCondition;
  Fault f;
  
  if (((this->state).ptr != (AsyncCapabilityStream *)0x0) &&
     (_kjCondition = (this->ownState).ptr != (AsyncCapabilityStream *)0x0, !_kjCondition)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[82]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xe9,FAILED,"state == kj::none || ownState.get() != nullptr",
               "_kjCondition,\"destroying AsyncPipe with operation still in-progress; probably going to segfault\""
               ,&_kjCondition,
               (char (*) [82])
               "destroying AsyncPipe with operation still in-progress; probably going to segfault");
    kj::_::Debug::Fault::~Fault(&f);
  }
  if (((this->readAbortPromise).ptr.isSet == true) &&
     (pFVar1 = (this->readAbortPromise).ptr.field_1.value.hub.ptr,
     pFVar1 != (ForkHub<kj::_::Void> *)0x0)) {
    (this->readAbortPromise).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
    pDVar2 = (this->readAbortPromise).ptr.field_1.value.hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  pPVar3 = (this->readAbortFulfiller).ptr.ptr;
  if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
    (this->readAbortFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    pDVar2 = (this->readAbortFulfiller).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pPVar3->super_PromiseRejector)._vptr_PromiseRejector +
                      (long)(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[-2]));
  }
  pAVar4 = (this->ownState).ptr;
  if (pAVar4 != (AsyncCapabilityStream *)0x0) {
    (this->ownState).ptr = (AsyncCapabilityStream *)0x0;
    pDVar2 = (this->ownState).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pAVar4->super_AsyncIoStream).super_AsyncInputStream.
                              _vptr_AsyncInputStream +
                      (long)(pAVar4->super_AsyncIoStream).super_AsyncInputStream.
                            _vptr_AsyncInputStream[-2]));
  }
  Refcounted::~Refcounted(&this->super_Refcounted);
  AsyncObject::~AsyncObject
            ((AsyncObject *)
             &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

~AsyncPipe() noexcept(false) {
    KJ_REQUIRE(state == kj::none || ownState.get() != nullptr,
        "destroying AsyncPipe with operation still in-progress; probably going to segfault") {
      // Don't std::terminate().
      break;
    }
  }